

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

void __thiscall banksia::ChessBoard::takeBack(ChessBoard *this,Hist *hist)

{
  int iVar1;
  pointer pPVar2;
  ulong uVar3;
  int iVar4;
  Piece PVar5;
  long lVar6;
  Piece PVar7;
  int iVar8;
  
  uVar3 = (ulong)(hist->move).super_Move.dest;
  pPVar2 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->super_BoardCore).pieces.
                            super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3)) {
    PVar7 = pPVar2[uVar3];
    pPVar2[(hist->move).super_Move.from] = PVar7;
    iVar4 = (hist->move).super_Move.dest;
    if ((PVar7.type == pawn) && (hist->enpassant == iVar4)) {
      lVar6 = (long)iVar4;
      iVar4 = (uint)(PVar7.side == white) * 0x10 + iVar4 + -8;
      pPVar2 = (this->super_BoardCore).pieces.
               super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6;
      pPVar2->type = empty;
      pPVar2->side = none;
    }
    (this->super_BoardCore).pieces.
    super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4] = hist->cap;
    if (PVar7.type == king) {
      iVar4 = (hist->move).super_Move.from;
      iVar1 = (hist->move).super_Move.dest;
      if (((iVar4 - iVar1) + 2U & 0xfffffffb) == 0) {
        iVar8 = iVar4 + 3;
        if (iVar1 <= iVar4) {
          iVar8 = iVar4 + -4;
        }
        (this->super_BoardCore).pieces.
        super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = (Piece)((ulong)(7 < iVar1) << 0x20 | 3);
        pPVar2 = (this->super_BoardCore).pieces.
                 super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                 super__Vector_impl_data._M_start + (iVar4 + iVar1) / 2;
        pPVar2->type = empty;
        pPVar2->side = none;
      }
    }
    if ((hist->move).super_Move.promotion != empty) {
      PVar5.type = pawn;
      PVar5.side = white;
      PVar7.type = pawn;
      PVar7.side = black;
      if ((hist->move).super_Move.dest < 8) {
        PVar7 = PVar5;
      }
      (this->super_BoardCore).pieces.
      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
      super__Vector_impl_data._M_start[(hist->move).super_Move.from] = PVar7;
    }
    (this->super_BoardCore).status = hist->status;
    this->castleRights[0] = hist->castleRights[0];
    this->castleRights[1] = hist->castleRights[1];
    this->enpassant = hist->enpassant;
    (this->super_BoardCore).quietCnt = hist->quietCnt;
    (this->super_BoardCore).hashKey = hist->hashKey;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
}

Assistant:

void ChessBoard::takeBack(const Hist& hist) {
    auto movep = getPiece(hist.move.dest);
    setPiece(hist.move.from, movep);
    
    int capPos = hist.move.dest;
    
    if (movep.type == PieceType::pawn && hist.enpassant == hist.move.dest) {
        capPos = hist.move.dest + (movep.side == Side::white ? +8 : -8);
        setEmpty(hist.move.dest);
    }
    setPiece(capPos, hist.cap);
    
    if (movep.type == PieceType::king) {
        if (abs(hist.move.from - hist.move.dest) == 2) {
            int rookPos = hist.move.from + (hist.move.from < hist.move.dest ? 3 : -4);
            assert(isEmpty(rookPos));
            int newRookPos = (hist.move.from + hist.move.dest) / 2;
            setPiece(rookPos, Piece(PieceType::rook, hist.move.dest < 8 ? Side::black : Side::white));
            setEmpty(newRookPos);
        }
    }
    
    if (hist.move.promotion != PieceType::empty) {
        setPiece(hist.move.from, Piece(PieceType::pawn, hist.move.dest < 8 ? Side::white : Side::black));
    }
    
    status = hist.status;
    castleRights[0] = hist.castleRights[0];
    castleRights[1] = hist.castleRights[1];
    enpassant = hist.enpassant;
    quietCnt = hist.quietCnt;
    
    //    pieceList_takeback(hist);
    hashKey = hist.hashKey;
}